

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pHVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  int i;
  int iVar5;
  int i_1;
  const_iterator *pcVar6;
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar7;
  undefined8 *puVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *p_Var9;
  undefined8 *puVar10;
  pointer ppcVar11;
  byte bVar12;
  size_type old_count;
  pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  const_iterator in_stack_fffffffffffffdf8;
  const_iterator in_stack_fffffffffffffe40;
  uint local_174;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_170 [9];
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_128;
  HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_120;
  size_type local_118;
  undefined1 local_110 [80];
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_c0;
  undefined8 local_78 [9];
  
  bVar12 = 0;
  pcVar3 = UniqueObjectHelper<char_const*>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(char **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0x10) = pcVar3;
  iVar5 = 10;
  do {
    local_170[0]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         UniqueObjectHelper<char_const*>(iVar5);
    google::
    sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert((pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_110,this_00,(value_type *)local_170);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 2000);
  local_128 = &(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_;
  local_118 = *(size_type *)
               ((long)&(this->
                       super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       ).
                       super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.
                       super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.rep.table + 0x38);
  iVar5 = 10;
  local_120 = this;
  do {
    local_174 = 1;
    local_c0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                   *)UniqueObjectHelper<char_const*>(iVar5);
    local_170[0]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         google::
         sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         ::erase(&this_00->rep,(key_type *)&local_c0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_110,"1u","this->ht_.erase(this->UniqueKey(i))",&local_174,
               (unsigned_long *)local_170);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_170);
      ppcVar11 = (pointer)0xafc493;
      if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)local_110._8_8_ !=
          (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        ppcVar11 = *(pointer *)local_110._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x41f,(char *)ppcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if (local_170[0]._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_170[0]._M_head_impl + 8))();
      }
    }
    uVar2 = local_110._8_8_;
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ !=
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((int **)*(pointer *)local_110._8_8_ !=
          &(((Settings *)(local_110._8_8_ + 8))->
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete(*(pointer *)local_110._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 1000);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::begin((const_iterator *)local_110,&this_00->rep);
  pHVar1 = local_120;
  local_110._72_8_ = local_128;
  pcVar6 = (const_iterator *)local_110;
  puVar8 = local_78;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = pcVar6->ht;
    pcVar6 = (const_iterator *)((long)pcVar6 + (ulong)bVar12 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
  }
  local_c0.pos.row_begin._M_current =
       ((_Vector_impl_data *)
       ((long)&(local_120->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table + 0x10))->_M_start;
  local_c0.pos.row_end._M_current =
       *(pointer *)
        ((long)&(local_120->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x18);
  local_c0.pos.col_current = (const_nonempty_iterator)0x0;
  local_c0.end.col_current = (const_nonempty_iterator)0x0;
  local_c0.ht = &this_00->rep;
  local_c0.pos.row_current._M_current = local_c0.pos.row_end._M_current;
  local_c0.end.row_begin._M_current = local_c0.pos.row_begin._M_current;
  local_c0.end.row_end._M_current = local_c0.pos.row_end._M_current;
  local_c0.end.row_current._M_current = local_c0.pos.row_end._M_current;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_c0);
  psVar7 = &local_c0;
  p_Var9 = local_170;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    p_Var9->_M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar7->ht;
    psVar7 = (sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar7 + (ulong)bVar12 * -0x10 + 8);
    p_Var9 = p_Var9 + (ulong)bVar12 * -2 + 1;
  }
  puVar8 = local_78;
  puVar10 = (undefined8 *)&stack0xfffffffffffffdf8;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
  }
  p_Var9 = local_170;
  puVar8 = (undefined8 *)&stack0xfffffffffffffe40;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = p_Var9->_M_head_impl;
    p_Var9 = p_Var9 + (ulong)bVar12 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
  }
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe40);
  local_c0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)((ulong)local_c0.ht & 0xffffffff00000000);
  local_170[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (*(size_type *)
         ((long)&(pHVar1->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.table + 0x40) -
       (pHVar1->
       super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_110,"0u","this->ht_.size()",(uint *)&local_c0,
             (unsigned_long *)local_170);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar11 = (pointer)0xafc493;
    }
    else {
      ppcVar11 = *(pointer *)local_110._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x422,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_170[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170[0]._M_head_impl + 8))();
    }
  }
  uVar2 = local_110._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_110._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_110._8_8_ !=
        &(((Settings *)(local_110._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_110._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_170[0]._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&(pHVar1->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_110,"old_count","this->ht_.bucket_count()",&local_118,
             (unsigned_long *)local_170);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar11 = (pointer)0xafc493;
    }
    else {
      ppcVar11 = *(pointer *)local_110._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x423,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_170[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170[0]._M_head_impl + 8))();
    }
  }
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_110._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_110._8_8_ !=
        &(((Settings *)(local_110._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_110._8_8_);
    }
    operator_delete((void *)local_110._8_8_);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}